

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQObject __thiscall SQFuncState::CreateString(SQFuncState *this,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectValue SVar3;
  SQObject SVar4;
  SQObjectPtr ns;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  local_30.super_SQObject._unVal.pString = SQString::Create(this->_sharedstate,s,len);
  local_30.super_SQObject._type = OT_STRING;
  if (local_30.super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_20.super_SQObject._type = OT_INTEGER;
    local_20.super_SQObject._unVal.nInteger = 1;
    SQTable::NewSlot((this->_strings).super_SQObject._unVal.pTable,&local_30,&local_20);
    SQObjectPtr::~SQObjectPtr(&local_20);
    SVar3 = local_30.super_SQObject._unVal;
    SVar2 = local_30.super_SQObject._type;
    SQObjectPtr::~SQObjectPtr(&local_30);
    SVar4._4_4_ = 0;
    SVar4._type = SVar2;
    SVar4._unVal.pTable = SVar3.pTable;
    return SVar4;
  }
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.h"
                ,0xe9,"SQObjectPtr::SQObjectPtr(SQString *)");
}

Assistant:

SQObject SQFuncState::CreateString(const SQChar *s,SQInteger len)
{
    SQObjectPtr ns(SQString::Create(_sharedstate,s,len));
    _table(_strings)->NewSlot(ns,(SQInteger)1);
    return ns;
}